

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

DefinitionLookupResult * __thiscall
slang::ast::Compilation::getDefinition
          (DefinitionLookupResult *__return_storage_ptr__,Compilation *this,string_view lookupName,
          Scope *scope,ConfigRule *configRule,SourceRange sourceRange,DiagCode code)

{
  group_type_pointer pgVar1;
  RootSymbol *pRVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ConfigRule *pCVar8;
  bool bVar9;
  Diagnostic *this_00;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  value_type_pointer unaff_RBX;
  value_type_pointer __u;
  Symbol *pSVar13;
  group_type_pointer pgVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  SourceRange range;
  size_t seed;
  pointer local_b8;
  DefinitionLookupResult *local_a8;
  ConfigRule *local_a0;
  ConfigBlockSymbol *local_98;
  ConfigRule *pCStack_90;
  long local_80;
  group_type_pointer local_78;
  ulong local_70;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> local_68;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  local_68.first.configRule = (ConfigRule *)lookupName._M_str;
  local_68.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
  local_98 = (ConfigBlockSymbol *)0x0;
  pCStack_90 = (ConfigRule *)0x0;
  pRVar2 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_68.first.definition = (Symbol *)&pRVar2->super_Scope;
  if (pRVar2 == (RootSymbol *)0x0) {
    local_68.first.definition = (Symbol *)0x0;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = seed;
  _seed = auVar7 << 0x40;
  local_a0 = configRule;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 *)&local_68);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = seed;
  uVar15 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,0);
  uVar11 = uVar15 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar12 = (uVar15 & 0xff) * 4;
  uVar18 = (&UNK_009584ac)[lVar12];
  uVar19 = (&UNK_009584ad)[lVar12];
  uVar20 = (&UNK_009584ae)[lVar12];
  uVar21 = (&UNK_009584af)[lVar12];
  uVar16 = 0;
  uVar22 = uVar18;
  uVar23 = uVar19;
  uVar24 = uVar20;
  uVar25 = uVar21;
  uVar26 = uVar18;
  uVar27 = uVar19;
  uVar28 = uVar20;
  uVar29 = uVar21;
  uVar30 = uVar18;
  uVar31 = uVar19;
  uVar32 = uVar20;
  uVar33 = uVar21;
  do {
    pgVar14 = (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.groups_;
    pgVar1 = pgVar14 + uVar11;
    auVar17[0] = -(pgVar1->m[0].n == uVar18);
    auVar17[1] = -(pgVar1->m[1].n == uVar19);
    auVar17[2] = -(pgVar1->m[2].n == uVar20);
    auVar17[3] = -(pgVar1->m[3].n == uVar21);
    auVar17[4] = -(pgVar1->m[4].n == uVar22);
    auVar17[5] = -(pgVar1->m[5].n == uVar23);
    auVar17[6] = -(pgVar1->m[6].n == uVar24);
    auVar17[7] = -(pgVar1->m[7].n == uVar25);
    auVar17[8] = -(pgVar1->m[8].n == uVar26);
    auVar17[9] = -(pgVar1->m[9].n == uVar27);
    auVar17[10] = -(pgVar1->m[10].n == uVar28);
    auVar17[0xb] = -(pgVar1->m[0xb].n == uVar29);
    auVar17[0xc] = -(pgVar1->m[0xc].n == uVar30);
    auVar17[0xd] = -(pgVar1->m[0xd].n == uVar31);
    auVar17[0xe] = -(pgVar1->m[0xe].n == uVar32);
    auVar17[0xf] = -(pgVar1->m[0xf].n == uVar33);
    uVar10 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    lVar12 = uVar11 * 0x10;
    local_70 = uVar11;
    if (uVar10 != 0) {
      ppVar3 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.elements_;
      local_a8 = __return_storage_ptr__;
      local_80 = uVar11 * 0x10;
      local_78 = pgVar14;
      local_48 = uVar18;
      uStack_47 = uVar19;
      uStack_46 = uVar20;
      uStack_45 = uVar21;
      uStack_44 = uVar22;
      uStack_43 = uVar23;
      uStack_42 = uVar24;
      uStack_41 = uVar25;
      uStack_40 = uVar26;
      uStack_3f = uVar27;
      uStack_3e = uVar28;
      uStack_3d = uVar29;
      uStack_3c = uVar30;
      uStack_3b = uVar31;
      uStack_3a = uVar32;
      uStack_39 = uVar33;
      do {
        uVar5 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __u = ppVar3 + uVar11 * 0xf + (ulong)uVar5;
        bVar9 = std::
                __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        *)&local_68,&__u->first);
        __return_storage_ptr__ = local_a8;
        if (bVar9) goto LAB_0017c999;
        uVar10 = uVar10 - 1 & uVar10;
      } while (uVar10 != 0);
      lVar12 = local_80;
      __u = unaff_RBX;
      pgVar14 = local_78;
      uVar18 = local_48;
      uVar19 = uStack_47;
      uVar20 = uStack_46;
      uVar21 = uStack_45;
      uVar22 = uStack_44;
      uVar23 = uStack_43;
      uVar24 = uStack_42;
      uVar25 = uStack_41;
      uVar26 = uStack_40;
      uVar27 = uStack_3f;
      uVar28 = uStack_3e;
      uVar29 = uStack_3d;
      uVar30 = uStack_3c;
      uVar31 = uStack_3b;
      uVar32 = uStack_3a;
      uVar33 = uStack_39;
      if (bVar9) goto LAB_0017c999;
    }
    if ((pgVar14->m[lVar12 + 0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
    uVar4 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar12 = local_70 + uVar16;
    uVar16 = uVar16 + 1;
    uVar11 = lVar12 + 1U & uVar4;
  } while (uVar16 <= uVar4);
  __u = (value_type_pointer)0x0;
LAB_0017c999:
  pCVar8 = local_a0;
  if (__u == (value_type_pointer)0x0) {
    _seed = (undefined1  [16])0x0;
    local_b8 = (pointer)0x0;
    resolveConfigRules(&local_68,this,lookupName,scope,(ResolvedConfig *)0x0,local_a0,
                       (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)&seed)
    ;
    pSVar13 = local_68.first.definition;
    local_98 = local_68.first.configRoot;
    pCStack_90 = local_68.first.configRule;
    if (seed != 0) {
      operator_delete((void *)seed,(long)local_b8 - seed);
    }
  }
  else {
    resolveConfigRules(&local_68,this,lookupName,scope,(ResolvedConfig *)0x0,local_a0,
                       &(__u->second).first);
    local_98 = local_68.first.configRoot;
    pCStack_90 = local_68.first.configRule;
    pSVar13 = local_68.first.definition;
  }
  if (((pSVar13 == (Symbol *)0x0) && (local_68.second == false)) &&
     (this_00 = errorMissingDef(this,lookupName,scope,sourceRange,code),
     this_00 != (Diagnostic *)0x0)) {
    range = slang::syntax::SyntaxNode::sourceRange((pCVar8->syntax).ptr);
    Diagnostic::addNote(this_00,(DiagCode)0x40001,range);
  }
  __return_storage_ptr__->definition = pSVar13;
  __return_storage_ptr__->configRoot = local_98;
  __return_storage_ptr__->configRule = pCStack_90;
  return __return_storage_ptr__;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::getDefinition(std::string_view lookupName,
                                                               const Scope& scope,
                                                               const ConfigRule& configRule,
                                                               SourceRange sourceRange,
                                                               DiagCode code) const {
    std::pair<DefinitionLookupResult, bool> result;
    if (auto it = definitionMap.find({lookupName, root.get()}); it != definitionMap.end())
        result = resolveConfigRules(lookupName, scope, nullptr, &configRule, it->second.first);
    else
        result = resolveConfigRules(lookupName, scope, nullptr, &configRule, {});

    if (!result.first.definition && !result.second) {
        // No definition found and no error issued, so issue one ourselves.
        auto diag = errorMissingDef(lookupName, scope, sourceRange, code);
        if (diag)
            diag->addNote(diag::NoteConfigRule, configRule.syntax->sourceRange());
    }

    return result.first;
}